

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_list::erase_peers
          (peer_list *this,torrent_state *state,erase_peer_flags_t flags)

{
  _Map_pointer ppptVar1;
  _Map_pointer ppptVar2;
  torrent_peer *pe;
  bool bVar3;
  ulong uVar4;
  torrent_peer **pptVar5;
  _Elt_pointer pptVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  iterator *i;
  long lVar14;
  torrent_peer **pptVar15;
  int iVar16;
  uint local_d4;
  uint local_d0;
  iterator local_a8;
  ulong local_88;
  long local_80;
  torrent_peer **local_78;
  iterator local_70;
  iterator local_50;
  
  iVar16 = state->max_peerlist_size;
  if ((iVar16 != 0) &&
     ((this->m_peers).
      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      .
      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_peers).
      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      .
      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
    if (*(uint *)&this->field_0x60 >> 0x1f != (uint)state->is_finished) {
      recalculate_connect_candidates(this,state);
    }
    ppptVar1 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar4 = random((aux *)(ulong)(((int)((ulong)((long)(this->m_peers).
                                                                                                              
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                                                (long)(this->m_peers).
                                                                                                            
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)
                                        >> 3) +
                                  (int)((ulong)((long)(this->m_peers).
                                                                                                            
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                               (long)(this->m_peers).
                                                                                                          
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_first
                                               ) >> 3) +
                                  ((((uint)((int)ppptVar1 -
                                           *(int *)&(this->m_peers).
                                                                                                        
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node)
                                    >> 3) - 1) + (uint)(ppptVar1 == (_Map_pointer)0x0)) * 0x40) - 1)
                  );
    iVar7 = (iVar16 * 0x5f) / 100;
    ppptVar1 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar13 = (int)((ulong)((long)(this->m_peers).
                                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 .
                                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
             (int)((ulong)((long)(this->m_peers).
                                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 .
                                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
             ((((uint)((int)ppptVar1 -
                      *(int *)&(this->m_peers).
                               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               .
                               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (uint)(ppptVar1 == (_Map_pointer)0x0)) * 0x40;
    if (iVar13 < 1) {
      local_d0 = 0xffffffff;
      uVar11 = 0xffffffff;
    }
    else {
      local_88 = (ulong)(iVar7 - (uint)(iVar7 == iVar16));
      iVar16 = 300;
      if (iVar13 < 300) {
        iVar16 = iVar13;
      }
      iVar16 = iVar16 + 1;
      local_d4 = 0xffffffff;
      local_d0 = 0xffffffff;
      do {
        ppptVar1 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppptVar2 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        pptVar6 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar15 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
        iVar7 = (int)((ulong)((long)pptVar15 - (long)pptVar6) >> 3) +
                (int)((ulong)((long)(this->m_peers).
                                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    .
                                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                             (long)(this->m_peers).
                                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                   .
                                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
                ((((uint)((int)ppptVar1 - (int)ppptVar2) >> 3) - 1) +
                (uint)(ppptVar1 == (_Map_pointer)0x0)) * 0x40;
        uVar11 = local_d4;
        if (iVar7 < (int)local_88) break;
        uVar9 = 0;
        if ((int)uVar4 != iVar7) {
          uVar9 = uVar4 & 0xffffffff;
        }
        uVar4 = uVar9;
        uVar12 = (uint)uVar4;
        local_80 = (long)(int)uVar12;
        local_78 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
        lVar14 = (long)pptVar6 - (long)local_78 >> 3;
        uVar9 = local_80 + lVar14;
        if (uVar9 < 0x40) {
          pptVar5 = pptVar6 + local_80;
        }
        else {
          uVar8 = uVar9 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar9) {
            uVar8 = uVar9 >> 6;
          }
          pptVar5 = ppptVar2[uVar8] + uVar9 + uVar8 * -0x40;
        }
        pe = *pptVar5;
        bVar3 = is_erase_candidate(this,pe);
        if (bVar3) {
          if (local_d4 != 0xffffffff) {
            uVar8 = (int)local_d4 + lVar14;
            if (uVar8 < 0x40) {
              pptVar5 = pptVar6 + (int)local_d4;
            }
            else {
              uVar10 = uVar8 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar8) {
                uVar10 = uVar8 >> 6;
              }
              pptVar5 = ppptVar2[uVar10] + uVar8 + uVar10 * -0x40;
            }
            bVar3 = anon_unknown.dwarf_a22a5d::compare_peer_erase(*pptVar5,pe);
            if (bVar3) goto LAB_00289a2c;
          }
          uVar11 = uVar12;
          if ((this->m_locked_peer == pe) || ((*(uint *)&pe->field_0x1b & 0x7e0000) != 0x200000))
          goto LAB_00289a2c;
          local_a8._M_first = local_78;
          if (uVar9 < 0x40) {
            local_a8._M_cur = pptVar6 + local_80;
            local_a8._M_last = pptVar15;
            local_a8._M_node = ppptVar2;
          }
          else {
            uVar8 = uVar9 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar9) {
              uVar8 = uVar9 >> 6;
            }
            local_a8._M_node = ppptVar2 + uVar8;
            local_a8._M_first = *local_a8._M_node;
            local_a8._M_last = local_a8._M_first + 0x40;
            local_a8._M_cur = local_a8._M_first + uVar9 + uVar8 * -0x40;
          }
          uVar11 = local_d4 - ((int)uVar12 < (int)local_d4);
          local_d0 = local_d0 - ((int)uVar12 < (int)local_d0);
          erase_peer(this,&local_a8,state);
        }
        else {
LAB_00289a2c:
          if ((this->m_locked_peer != pe) && (pe->connection == (peer_connection_interface *)0x0)) {
            if (local_d0 != 0xffffffff) {
              uVar4 = lVar14 + (int)local_d0;
              if (uVar4 < 0x40) {
                pptVar15 = pptVar6 + (int)local_d0;
              }
              else {
                uVar9 = uVar4 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar4) {
                  uVar9 = uVar4 >> 6;
                }
                pptVar15 = ppptVar2[uVar9] + uVar4 + uVar9 * -0x40;
              }
              bVar3 = anon_unknown.dwarf_a22a5d::compare_peer_erase(*pptVar15,pe);
              if (bVar3) goto LAB_00289b2d;
            }
            local_d0 = uVar12;
          }
LAB_00289b2d:
          uVar4 = (ulong)(uVar12 + 1);
        }
        iVar16 = iVar16 + -1;
        local_d4 = uVar11;
      } while (1 < iVar16);
    }
    if ((int)uVar11 < 0) {
      if ((flags.m_val & 2) == 0) {
        return;
      }
      if ((int)local_d0 < 0) {
        return;
      }
      local_70._M_cur =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_70._M_first =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_70._M_last =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_70._M_node =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      uVar4 = ((long)local_70._M_cur - (long)local_70._M_first >> 3) + (ulong)local_d0;
      if (uVar4 < 0x40) {
        pptVar6 = local_70._M_cur + local_d0;
      }
      else {
        uVar9 = uVar4 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar4) {
          uVar9 = uVar4 >> 6;
        }
        local_70._M_node = local_70._M_node + uVar9;
        local_70._M_first = *local_70._M_node;
        local_70._M_last = local_70._M_first + 0x40;
        pptVar6 = local_70._M_first + uVar4 + uVar9 * -0x40;
      }
      i = &local_70;
    }
    else {
      local_50._M_cur =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_50._M_first =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_50._M_last =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_50._M_node =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      uVar4 = ((long)local_50._M_cur - (long)local_50._M_first >> 3) + (ulong)uVar11;
      if (uVar4 < 0x40) {
        pptVar6 = local_50._M_cur + uVar11;
      }
      else {
        uVar9 = uVar4 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar4) {
          uVar9 = uVar4 >> 6;
        }
        local_50._M_node = local_50._M_node + uVar9;
        local_50._M_first = *local_50._M_node;
        local_50._M_last = local_50._M_first + 0x40;
        pptVar6 = local_50._M_first + uVar4 + uVar9 * -0x40;
      }
      i = &local_50;
    }
    i->_M_cur = pptVar6;
    erase_peer(this,i,state);
  }
  return;
}

Assistant:

void peer_list::erase_peers(torrent_state* state, erase_peer_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		int max_peerlist_size = state->max_peerlist_size;

		if (max_peerlist_size == 0 || m_peers.empty()) return;

		int erase_candidate = -1;
		int force_erase_candidate = -1;

		if (bool(m_finished) != state->is_finished)
			recalculate_connect_candidates(state);

		int round_robin = aux::numeric_cast<int>(random(std::uint32_t(m_peers.size() - 1)));

		int low_watermark = max_peerlist_size * 95 / 100;
		if (low_watermark == max_peerlist_size) --low_watermark;

		for (int iterations = std::min(int(m_peers.size()), 300);
			iterations > 0; --iterations)
		{
			if (int(m_peers.size()) < low_watermark)
				break;

			if (round_robin == int(m_peers.size())) round_robin = 0;

			torrent_peer& pe = *m_peers[round_robin];
			TORRENT_ASSERT(pe.in_use);
			int const current = round_robin;

			if (is_erase_candidate(pe)
				&& (erase_candidate == -1
					|| !compare_peer_erase(*m_peers[erase_candidate], pe)))
			{
				if (should_erase_immediately(pe))
				{
					if (erase_candidate > current) --erase_candidate;
					if (force_erase_candidate > current) --force_erase_candidate;
					TORRENT_ASSERT(current >= 0 && current < int(m_peers.size()));
					erase_peer(m_peers.begin() + current, state);
					continue;
				}
				else
				{
					erase_candidate = current;
				}
			}
			if (is_force_erase_candidate(pe)
				&& (force_erase_candidate == -1
					|| !compare_peer_erase(*m_peers[force_erase_candidate], pe)))
			{
				force_erase_candidate = current;
			}

			++round_robin;
		}

		if (erase_candidate > -1)
		{
			TORRENT_ASSERT(erase_candidate >= 0 && erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + erase_candidate, state);
		}
		else if ((flags & force_erase) && force_erase_candidate > -1)
		{
			TORRENT_ASSERT(force_erase_candidate >= 0 && force_erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + force_erase_candidate, state);
		}
	}